

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O0

void lsvm::hashmap::print(hashmap *h)

{
  uint uVar1;
  hashbucket **pphVar2;
  hashmap *in_RDI;
  float fVar3;
  float lf;
  uint32_t sum_count;
  hashbucket *b;
  float lf_sumi;
  float lf_sum;
  uint32_t e;
  uint32_t i;
  hashbucket **bp;
  uint32_t max_partitions;
  uint local_34;
  hashbucket *local_30;
  float local_28;
  float local_24;
  int local_20;
  uint local_1c;
  
  printf("hashmap: [count:%d][partitions:%d/%d][max_depth:%d][new_bucket_size:%d,range=%d,avg_bucket_size:%d]\npartitions: ["
         ,(ulong)in_RDI->count,(ulong)in_RDI->bits,(ulong)in_RDI->max_bits,(ulong)in_RDI->max_depth,
         (ulong)*(uint *)(primes + (ulong)in_RDI->new_bucket_indx * 4),(uint)in_RDI->range,
         *(undefined4 *)(primes + (ulong)in_RDI->avg_bucket_indx * 4));
  uVar1 = in_RDI->bits + 1;
  pphVar2 = buckets(in_RDI);
  for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
    printf(" %d:%p ",(ulong)local_1c,pphVar2[local_1c]);
  }
  printf("]\n");
  local_20 = 0;
  local_24 = 0.0;
  local_28 = 0.0;
  for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
    if (pphVar2[local_1c] != (hashbucket *)0x0) {
      local_30 = pphVar2[local_1c];
      printf("%d: %p - ",(ulong)local_1c,local_30);
      local_34 = 0;
      for (; local_30 != (hashbucket *)0x0; local_30 = local_30->next) {
        fVar3 = (float)local_30->count /
                (float)*(uint *)(primes + (ulong)local_30->bucket_size_indx * 4);
        local_24 = fVar3 + local_24;
        local_28 = local_28 + 1.0;
        printf("[count:%d,bucket_size:%d,load_factor=%.2f] ",(double)fVar3,(ulong)local_30->count,
               (ulong)*(uint *)(primes + (ulong)local_30->bucket_size_indx * 4));
        local_20 = (*(int *)(primes + (ulong)local_30->bucket_size_indx * 4) - local_30->count) +
                   local_20;
        local_34 = local_30->count + local_34;
      }
      printf("[sum_count=%d]\n",(ulong)local_34);
    }
  }
  printf("count=%d, empty=%d, load_factor=%.2f, avg_load_factor=%.2f\n",
         (double)((float)in_RDI->count / (float)(local_20 + in_RDI->count)),
         (double)(local_24 / local_28));
  return;
}

Assistant:

void print(hashmap* h){
    printf("hashmap: [count:%d][partitions:%d/%d][max_depth:%d][new_bucket_size:%d,range=%d,avg_bucket_size:%d]\npartitions: [",h->count, h->bits,h->max_bits, h->max_depth, primes[h->new_bucket_indx],h->range,primes[h->avg_bucket_indx]);
    
    uint32_t max_partitions = partition_count(h->bits);
    hashbucket** bp = buckets(h);
    uint32_t i = 0;
    while(i < max_partitions){
        printf(" %d:%p ",i,bp[i]);
        ++i;
    }
    printf("]\n");

    i = 0;
    uint32_t e = 0;
    float lf_sum = 0.0f; float lf_sumi = 0;
    while(i < max_partitions){
        if(bp[i] != null){
            hashbucket* b = bp[i];
            printf("%d: %p - ",i,b);
            uint32_t sum_count = 0;
            while(b != null){
                float lf = ((float)b->count)/bucket_size(b);
                lf_sum  += lf; lf_sumi += 1;
                printf("[count:%d,bucket_size:%d,load_factor=%.2f] ",b->count,bucket_size(b),lf);
                e += bucket_size(b)-b->count;
                sum_count += b->count;
                b = b->next;
            }
        
            printf("[sum_count=%d]\n",sum_count);
        }
        ++i;
    }
    printf("count=%d, empty=%d, load_factor=%.2f, avg_load_factor=%.2f\n",h->count,e,((float)h->count)/(e+h->count),lf_sum/lf_sumi);
}